

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundShape.cpp
# Opt level: O2

void __thiscall btCompoundShape::removeChildShapeByIndex(btCompoundShape *this,int childShapeIndex)

{
  int *piVar1;
  
  this->m_updateRevision = this->m_updateRevision + 1;
  if (this->m_dynamicAabbTree != (btDbvt *)0x0) {
    btDbvt::remove(this->m_dynamicAabbTree,(char *)(this->m_children).m_data[childShapeIndex].m_node
                  );
  }
  btAlignedObjectArray<btCompoundShapeChild>::swap
            (&this->m_children,childShapeIndex,(this->m_children).m_size + -1);
  if (this->m_dynamicAabbTree != (btDbvt *)0x0) {
    (((this->m_children).m_data[childShapeIndex].m_node)->field_2).dataAsInt = childShapeIndex;
  }
  piVar1 = &(this->m_children).m_size;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void btCompoundShape::removeChildShapeByIndex(int childShapeIndex)
{
	m_updateRevision++;
	btAssert(childShapeIndex >=0 && childShapeIndex < m_children.size());
	if (m_dynamicAabbTree)
	{
		m_dynamicAabbTree->remove(m_children[childShapeIndex].m_node);
	}
	m_children.swap(childShapeIndex,m_children.size()-1);
    if (m_dynamicAabbTree) 
		m_children[childShapeIndex].m_node->dataAsInt = childShapeIndex;
	m_children.pop_back();

}